

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

node * __thiscall
sjtu::
LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
::load(LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
       *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  CacheNode *pCVar4;
  Node *pNVar5;
  CacheNode *__dest;
  CacheNode *pCVar6;
  CacheNode **ppCVar7;
  value_type local_9a8;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_998;
  node local_980;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar5 = pNVar1->left;
  if (pNVar5 != pNVar1) {
    do {
      lVar2 = pNVar5->value->first;
      if (lVar2 == *offset) break;
      pNVar5 = (&pNVar5->left)[lVar2 <= *offset];
    } while (pNVar5 != pNVar1);
  }
  if (pNVar5 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    __dest = (CacheNode *)operator_new(0x988);
    f_read(&local_980,this,offset);
    memcpy(__dest,&local_980,0x960);
    local_9a8.first = *offset;
    __dest->offset = local_9a8.first;
    __dest->is_dirty_page = false;
    __dest->prec = (CacheNode *)0x0;
    __dest->succ = (CacheNode *)0x0;
    __dest->bel = this;
    local_9a8.second = __dest;
    map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
    ::insert(&local_998,&this->table,&local_9a8);
    if (this->block_lim == (this->table).tot) {
      pCVar6 = this->tail;
      pCVar3 = pCVar6->prec;
      this->tail = pCVar3;
      ppCVar7 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar7 = &this->head;
      }
      *ppCVar7 = (CacheNode *)0x0;
      CacheNode::~CacheNode(pCVar6);
      operator_delete(pCVar6,0x988);
    }
    pCVar6 = this->head;
    if (pCVar6 == (CacheNode *)0x0) {
      this->tail = __dest;
      goto LAB_0011a4a4;
    }
  }
  else {
    __dest = pNVar5->value->second;
    pCVar6 = this->head;
    if (__dest == pCVar6) {
      return &__dest->value;
    }
    pCVar3 = __dest->prec;
    pCVar4 = __dest->succ;
    pCVar3->succ = pCVar4;
    ppCVar7 = &pCVar4->prec;
    if (pCVar4 == (CacheNode *)0x0) {
      ppCVar7 = &this->tail;
    }
    *ppCVar7 = pCVar3;
    __dest->prec = (CacheNode *)0x0;
  }
  __dest->succ = pCVar6;
  pCVar6->prec = __dest;
LAB_0011a4a4:
  this->head = __dest;
  return &__dest->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}